

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateDebugReportObjectType
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *objectType)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  const_iterator cVar2;
  VulkanHppGenerator *this_00;
  allocator<char> local_59;
  undefined1 local_58 [32];
  string debugReportObjectType;
  
  std::__cxx11::string::string((string *)&debugReportObjectType,objectType);
  __lhs = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                    (&debugReportObjectType,3,0,"DEBUG_REPORT_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,__lhs
                 ,"_EXT");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&debugReportObjectType,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_58,"VkDebugReportObjectTypeEXT",&local_59);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::EnumData>_>_>
          ::find(&(this->m_enums)._M_t,(key_type *)local_58);
  this_00 = (VulkanHppGenerator *)local_58;
  std::__cxx11::string::~string((string *)this_00);
  if ((_Rb_tree_header *)cVar2._M_node != &(this->m_enums)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = contains(this_00,(vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                              *)&cVar2._M_node[5]._M_left,&debugReportObjectType);
    if (bVar1) {
      generateEnumValueName
                (__return_storage_ptr__,this,(string *)(cVar2._M_node + 1),&debugReportObjectType,
                 false);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"eUnknown",(allocator<char> *)local_58);
    }
    std::__cxx11::string::~string((string *)&debugReportObjectType);
    return __return_storage_ptr__;
  }
  __assert_fail("enumIt != m_enums.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                ,0x1972,
                "std::string VulkanHppGenerator::generateDebugReportObjectType(const std::string &) const"
               );
}

Assistant:

std::string VulkanHppGenerator::generateDebugReportObjectType( std::string const & objectType ) const
{
  std::string debugReportObjectType = objectType;
  debugReportObjectType             = debugReportObjectType.replace( 3, 0, "DEBUG_REPORT_" ) + "_EXT";
  auto enumIt                       = m_enums.find( "VkDebugReportObjectTypeEXT" );
  assert( enumIt != m_enums.end() );
  return contains( enumIt->second.values, debugReportObjectType ) ? generateEnumValueName( enumIt->first, debugReportObjectType, false ) : "eUnknown";
}